

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::compareEqual<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,wchar_t[4]>
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *lhs,wchar_t (*rhs) [4])

{
  size_t __n;
  wchar_t *__s1;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __rlen;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  sVar3 = wcslen(*rhs);
  if (__n == sVar3) {
    if (__n != 0) {
      iVar2 = wmemcmp(__s1,*rhs,__n);
      if (iVar2 != 0) goto LAB_00145001;
    }
    bVar1 = true;
  }
  else {
LAB_00145001:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }